

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O2

void drawTriangleRight(ostream *out,double x,double y,double width,double height)

{
  ostream *poVar1;
  
  std::operator<<(out,"\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"");
  std::operator<<(out,"M ");
  poVar1 = std::ostream::_M_insert<double>(width + x);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(height * 0.5 + y);
  std::operator<<(out," L ");
  poVar1 = std::ostream::_M_insert<double>(x);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(y + height);
  std::operator<<(out," L ");
  poVar1 = std::ostream::_M_insert<double>(x);
  std::operator<<(poVar1," ");
  std::ostream::_M_insert<double>(y);
  std::operator<<(out," z\"");
  std::operator<<(out,"/>\n");
  return;
}

Assistant:

void drawTriangleRight(ostream& out, double x, double y, double width, double height) {
	double& h = height;
	double& w = width;
	double x2 = x+w;
	double y2 = y+h;

	out << "\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"";
	out << "M " << x2 << " " << y+h/2;
	out << " L " << x << " " << y2;
	out << " L " << x << " " << y;
	out << " z\"";
	out << "/>\n";
}